

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

bool __thiscall
iDynTree::SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix
          (SixAxisForceTorqueSensor *this,LinkIndex link_index,
          Matrix6x6 *wrench_applied_on_link_inverse_matrix)

{
  LinkIndex LVar1;
  long in_RSI;
  SixAxisForceTorqueSensor *in_RDI;
  Transform sensor_H_link_1;
  Transform sensor_H_link;
  Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff9f0;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffa08;
  MatrixFixSize<6U,_6U> *in_stack_fffffffffffffa10;
  bool local_1;
  
  if (in_RSI == in_RDI->pimpl->link1) {
    iDynTree::Transform::inverse();
    LVar1 = getAppliedWrenchLink(in_RDI);
    if (LVar1 == in_RSI) {
      iDynTree::Transform::asAdjointTransformWrench();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                (in_stack_fffffffffffff9f0,
                 (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_RDI);
    }
    else {
      iDynTree::Transform::asAdjointTransformWrench();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::
      DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
      operator-(in_stack_fffffffffffffa08);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                (in_stack_fffffffffffff9f0,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)in_RDI);
    }
    local_1 = true;
  }
  else if (in_RSI == in_RDI->pimpl->link2) {
    iDynTree::Transform::inverse();
    LVar1 = getAppliedWrenchLink(in_RDI);
    if (LVar1 == in_RSI) {
      iDynTree::Transform::asAdjointTransformWrench();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                (in_stack_fffffffffffff9f0,
                 (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_RDI);
    }
    else {
      iDynTree::Transform::asAdjointTransformWrench();
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::
      DenseBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
      operator-(in_stack_fffffffffffffa08);
      toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffffa08);
      Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>::operator=
                (in_stack_fffffffffffff9f0,
                 (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)in_RDI);
    }
    local_1 = true;
  }
  else {
    MatrixFixSize<6U,_6U>::zero(in_stack_fffffffffffffa10);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix(const LinkIndex link_index,
                                                                   Matrix6x6& wrench_applied_on_link_inverse_matrix) const
{
    assert(this->isValid());

    if( link_index == this->pimpl->link1 )
    {
        Transform sensor_H_link = this->pimpl->link1_H_sensor.inverse();
        // If the measure wrench is the one applied on the other link, change sign
        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else if( link_index == this->pimpl->link2 )
    {
        Transform sensor_H_link = this->pimpl->link2_H_sensor.inverse();

        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else
    {
        assert(false);
        wrench_applied_on_link_inverse_matrix.zero();
        return false;
    }
}